

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O3

FT_Error CFF_Load_FD_Select(CFF_FDSelect fdselect,FT_UInt num_glyphs,FT_Stream stream,
                           FT_ULong offset)

{
  FT_Byte FVar1;
  FT_UInt16 FVar2;
  int local_24;
  
  local_24 = FT_Stream_Seek(stream,offset);
  if ((local_24 == 0) && (FVar1 = FT_Stream_ReadByte(stream,&local_24), local_24 == 0)) {
    fdselect->format = FVar1;
    fdselect->cache_count = 0;
    if (FVar1 != '\0') {
      if (FVar1 != '\x03') {
        return 3;
      }
      FVar2 = FT_Stream_ReadUShort(stream,&local_24);
      if (local_24 != 0) {
        return local_24;
      }
      if (FVar2 == 0) {
        return 3;
      }
      num_glyphs = (uint)FVar2 + (uint)FVar2 * 2 + 2;
    }
    fdselect->data_size = num_glyphs;
    local_24 = FT_Stream_ExtractFrame(stream,(ulong)num_glyphs,&fdselect->data);
  }
  return local_24;
}

Assistant:

static FT_Error
  CFF_Load_FD_Select( CFF_FDSelect  fdselect,
                      FT_UInt       num_glyphs,
                      FT_Stream     stream,
                      FT_ULong      offset )
  {
    FT_Error  error;
    FT_Byte   format;
    FT_UInt   num_ranges;


    /* read format */
    if ( FT_STREAM_SEEK( offset ) || FT_READ_BYTE( format ) )
      goto Exit;

    fdselect->format      = format;
    fdselect->cache_count = 0;   /* clear cache */

    switch ( format )
    {
    case 0:     /* format 0, that's simple */
      fdselect->data_size = num_glyphs;
      goto Load_Data;

    case 3:     /* format 3, a tad more complex */
      if ( FT_READ_USHORT( num_ranges ) )
        goto Exit;

      if ( !num_ranges )
      {
        FT_TRACE0(( "CFF_Load_FD_Select: empty FDSelect array\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Exit;
      }

      fdselect->data_size = num_ranges * 3 + 2;

    Load_Data:
      if ( FT_FRAME_EXTRACT( fdselect->data_size, fdselect->data ) )
        goto Exit;
      break;

    default:    /* hmm... that's wrong */
      error = FT_THROW( Invalid_File_Format );
    }

  Exit:
    return error;
  }